

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

_Bool xpk_decode_tiled(XPK *xpk)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  FILE *__s;
  int rv;
  FILE *out_f;
  XPK *pXStack_18;
  LPStatus status;
  XPK *xpk_local;
  
  pXStack_18 = xpk;
  _Var1 = XPK_TiledModeOK(xpk);
  if (_Var1) {
    rgba = XPK_DecodeTiledMode(pXStack_18,(LPStatus *)((long)&out_f + 4));
    if (out_f._4_4_ == LUNAPURPURA_OK) {
      if ((want_png & 1U) == 0) {
        __s = fopen(out_path,"wb");
        fwrite(rgba,4,0x4b000,__s);
        fclose(__s);
      }
      if (((want_png & 1U) == 0) ||
         (iVar2 = stbi_write_png(out_path,0x280,0x1e0,4,rgba,0xa00), iVar2 != 0)) {
        xpk_local._7_1_ = true;
      }
      else {
        LPWarn("xpk","stbi_write_png() failed: %d",0);
        xpk_local._7_1_ = false;
      }
    }
    else {
      pcVar3 = LPStatusString(out_f._4_4_);
      LPWarn("xpk","couldn\'t decode in tiled mode: %s",pcVar3);
      xpk_local._7_1_ = false;
    }
  }
  else {
    xpk_local._7_1_ = false;
  }
  return xpk_local._7_1_;
}

Assistant:

static bool
xpk_decode_tiled(const XPK *xpk)
{
	if (!XPK_TiledModeOK(xpk)) {
		return false;
	}

	LPStatus status;
	rgba = XPK_DecodeTiledMode(xpk, &status);

	if (status != LUNAPURPURA_OK) {
		LPWarn(LP_SUBSYSTEM_XPK, "couldn't decode in tiled mode: %s", LPStatusString(status));
		return false;
	}

#ifdef LUNAPURPURA_PNG_SUPPORT
	if (!want_png)
#else
	if (true)
#endif
	{
		FILE *out_f = fopen(out_path, "wb"); /* XXX make sure this is ok */
		fwrite(rgba, 4, 640*480, out_f);
		fclose(out_f);
	}

#ifdef LUNAPURPURA_PNG_SUPPORT
	if (want_png) {
		int rv = stbi_write_png(out_path, 640, 480, 4, rgba, 640*4);
		if (!rv) {
			LPWarn(LP_SUBSYSTEM_XPK, "stbi_write_png() failed: %d", rv);
			return false;
		}
	}
#endif

	return true;
}